

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

string * google::protobuf::compiler::python::anon_unknown_0::
         NamePrefixedWithNestedTypes<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,Descriptor *descriptor,string *separator)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string name;
  string prefix;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&local_b8,*(string **)(descriptor + 8));
  if (*(Descriptor **)(descriptor + 0x18) == (Descriptor *)0x0) {
    bVar1 = std::operator==(separator,".");
    if (bVar1) {
      ResolveKeyword(&local_78,&local_b8);
      std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,local_b8.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_b8.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_b8._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,local_b8.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_b8._M_string_length;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_local_buf[0] = '\0';
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    goto LAB_002c5926;
  }
  NamePrefixedWithNestedTypes<google::protobuf::Descriptor>
            (&local_78,*(Descriptor **)(descriptor + 0x18),separator);
  bVar1 = std::operator==(separator,".");
  if (bVar1) {
    bVar1 = IsPythonKeyword(&local_b8);
    if (!bVar1) goto LAB_002c5875;
    std::operator+(&local_58,"getattr(",&local_78);
    std::operator+(&local_38,&local_58,", \'");
    std::operator+(&local_98,&local_38,&local_b8);
    std::operator+(__return_storage_ptr__,&local_98,"\')");
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_38);
    this = &local_58;
  }
  else {
LAB_002c5875:
    std::operator+(&local_98,&local_78,separator);
    std::operator+(__return_storage_ptr__,&local_98,&local_b8);
    this = &local_98;
  }
  std::__cxx11::string::~string((string *)this);
  std::__cxx11::string::~string((string *)&local_78);
LAB_002c5926:
  std::__cxx11::string::~string((string *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::string NamePrefixedWithNestedTypes(const DescriptorT& descriptor,
                                        const std::string& separator) {
  std::string name = descriptor.name();
  const Descriptor* parent = descriptor.containing_type();
  if (parent != nullptr) {
    std::string prefix = NamePrefixedWithNestedTypes(*parent, separator);
    if (separator == "." && IsPythonKeyword(name)) {
      return "getattr(" + prefix + ", '" + name + "')";
    } else {
      return prefix + separator + name;
    }
  }
  if (separator == ".") {
    name = ResolveKeyword(name);
  }
  return name;
}